

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

StringRep *
google::protobuf::Arena::Create<google::protobuf::internal::MicroString::StringRep>(Arena *arena)

{
  StringRep *pSVar1;
  
  if (arena == (Arena *)0x0) {
    pSVar1 = (StringRep *)operator_new(0x30);
    (pSVar1->super_LargeRep).payload = (char *)0x0;
    (pSVar1->super_LargeRep).size = 0;
    (pSVar1->super_LargeRep).capacity = 0;
    (pSVar1->str)._M_dataplus._M_p = (pointer)0x0;
    (pSVar1->str)._M_string_length = 0;
    (pSVar1->str).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar1->str).field_2 + 8) = 0;
  }
  else {
    pSVar1 = (StringRep *)
             AllocateInternal<google::protobuf::internal::MicroString::StringRep,false>(arena);
    (pSVar1->super_LargeRep).payload = (char *)0x0;
    (pSVar1->super_LargeRep).size = 0;
    (pSVar1->super_LargeRep).capacity = 0;
    (pSVar1->str)._M_dataplus._M_p = (pointer)0x0;
    (pSVar1->str)._M_string_length = 0;
    (pSVar1->str).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar1->str).field_2 + 8) = 0;
  }
  (pSVar1->str)._M_dataplus._M_p = (pointer)&(pSVar1->str).field_2;
  (pSVar1->str).field_2._M_local_buf[0] = '\0';
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  Create(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    if constexpr (is_arena_constructable<T>::value) {
      using Type = std::remove_const_t<T>;
      // DefaultConstruct/CopyConstruct are optimized for messages, which
      // are both arena constructible and destructor skippable and they
      // assume much. Don't use these functions unless the invariants
      // hold.
      if constexpr (is_destructor_skippable<T>::value) {
        constexpr auto construct_type = GetConstructType<T, Args&&...>();
        // We delegate to DefaultConstruct/CopyConstruct where appropriate
        // because protobuf generated classes have external templates for
        // these functions for code size reasons. When `if constexpr` is not
        // available always use the fallback.
        if constexpr (construct_type == ConstructType::kDefault) {
          return static_cast<Type*>(DefaultConstruct<Type>(arena));
        } else if constexpr (construct_type == ConstructType::kCopy) {
          return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
        }
      }
      return CreateArenaCompatible<Type>(arena, std::forward<Args>(args)...);
    } else {
      if (ABSL_PREDICT_FALSE(arena == nullptr)) {
        return new T(std::forward<Args>(args)...);
      }
      return new (arena->AllocateInternal<T>()) T(std::forward<Args>(args)...);
    }
  }